

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

char * cimg_library::cimg::load_network
                 (char *url,char *filename_local,uint timeout,bool try_fallback)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *s;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  FILE *pFVar9;
  byte *pbVar10;
  CImgArgumentException *this;
  CImgIOException *this_00;
  undefined7 in_register_00000009;
  long lVar11;
  undefined4 in_register_00000014;
  byte bVar12;
  char *pcVar13;
  ulong uVar14;
  CImg<char> command;
  CImg<char> ext;
  CImg<char> local_78;
  uint local_54;
  CImg<char> local_50;
  
  if (url == (char *)0x0) {
    this = (CImgArgumentException *)
           __cxa_allocate_exception
                     (0x10,filename_local,CONCAT44(in_register_00000014,timeout),
                      CONCAT71(in_register_00000009,try_fallback));
    CImgArgumentException::CImgArgumentException
              (this,"cimg::load_network(): Specified URL is (null).");
LAB_0011c6e4:
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  pcVar8 = url;
  if (filename_local == (char *)0x0) {
    this = (CImgArgumentException *)
           __cxa_allocate_exception
                     (0x10,0,CONCAT44(in_register_00000014,timeout),
                      CONCAT71(in_register_00000009,try_fallback));
    CImgArgumentException::CImgArgumentException
              (this,"cimg::load_network(): Specified destination string is (null).");
    goto LAB_0011c6e4;
  }
  do {
    pcVar13 = pcVar8;
    pcVar6 = strchr(pcVar13,0x2e);
    pcVar8 = pcVar6 + 1;
  } while (url <= pcVar6 + 1);
  if (pcVar13 == url) {
    sVar7 = strlen(url);
    pcVar13 = url + sVar7;
  }
  cVar1 = *pcVar13;
  sVar7 = strlen(pcVar13 + -(ulong)(url < pcVar13 && cVar1 != '\0'));
  CImg<char>::CImg(&local_50,pcVar13 + -(ulong)(url < pcVar13 && cVar1 != '\0'),(int)sVar7 + 1,1,1,1
                   ,false);
  *filename_local = '\0';
  local_54 = timeout;
  if (local_50._width < 0x11) {
    pbVar10 = (byte *)local_50._data;
    if ((byte *)local_50._data == (byte *)0x0) {
LAB_0011c2b5:
      do {
        bVar2 = *pbVar10;
        uVar14 = (ulong)bVar2;
        if (uVar14 < 0x40) {
          if ((0xd400840400000000U >> (uVar14 & 0x3f) & 1) == 0) {
            if (uVar14 != 0) goto LAB_0011c2df;
            goto LAB_0011c23b;
          }
LAB_0011c2ce:
          *pbVar10 = 0x5f;
        }
        else {
LAB_0011c2df:
          if ((bVar2 == 0x7c) || (bVar2 == 0x5c)) goto LAB_0011c2ce;
        }
        pbVar10 = pbVar10 + 1;
      } while( true );
    }
    lVar11 = 0;
    do {
      bVar2 = local_50._data[lVar11];
      bVar3 = bVar2 + 0x20;
      if ((byte)(bVar2 + 0xa5) < 0xe6) {
        bVar3 = bVar2;
      }
      bVar2 = "cgi"[lVar11];
      bVar12 = bVar2 + 0x20;
      if ((byte)(bVar2 + 0xa5) < 0xe6) {
        bVar12 = bVar2;
      }
      if (bVar3 != bVar12) {
        if ((int)lVar11 != 3) goto LAB_0011c2b5;
        break;
      }
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 != 3);
  }
  *local_50._data = 0;
LAB_0011c23b:
  while( true ) {
    pcVar8 = temporary_path((char *)0x0,false);
    pcVar13 = filenamerand();
    snprintf(filename_local,0x100,"%s%c%s%s",pcVar8,0x2f,pcVar13,local_50._data);
    pFVar9 = ::fopen(filename_local,"rb");
    if (pFVar9 == (FILE *)0x0) break;
    if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (iVar4 = ::fclose(pFVar9), iVar4 != 0)) {
      warn("cimg::fclose(): Error code %d returned during file closing.");
    }
  }
  sVar7 = strlen(url);
  CImg<char>::CImg(&local_78,(int)sVar7 + 0x40,1,1,1);
  uVar5 = local_54;
  pcVar8 = local_78._data;
  uVar14 = (ulong)local_78._width;
  if (local_54 == 0) {
    pcVar13 = curl_path((char *)0x0,false);
    snprintf(pcVar8,uVar14,"%s -f --silent --compressed -o \"%s\" \"%s\"",pcVar13,filename_local,url
            );
  }
  else {
    pcVar13 = curl_path((char *)0x0,false);
    snprintf(pcVar8,uVar14,"%s -m %u -f --silent --compressed -o \"%s\" \"%s\"",pcVar13,(ulong)uVar5
             ,filename_local,url);
  }
  pcVar8 = local_78._data;
  sVar7 = strlen(local_78._data);
  uVar14 = sVar7 & 0xffffffff;
  if (uVar14 != 0) {
    pcVar13 = (char *)operator_new__((ulong)((int)sVar7 + 0x10));
    strncpy(pcVar13,pcVar8,uVar14);
    builtin_strncpy(pcVar13 + uVar14," 2> /dev/null",0xe);
    system(pcVar13);
    operator_delete__(pcVar13);
  }
  pFVar9 = ::fopen(filename_local,"rb");
  pcVar8 = local_78._data;
  if (pFVar9 == (FILE *)0x0) {
    uVar14 = (ulong)local_78._width;
    if (uVar5 == 0) {
      pcVar13 = wget_path((char *)0x0,false);
      snprintf(pcVar8,uVar14,"%s -q -r -l 0 --no-cache -O \"%s\" \"%s\"",pcVar13,filename_local,url)
      ;
    }
    else {
      pcVar13 = wget_path((char *)0x0,false);
      snprintf(pcVar8,uVar14,"%s -T %u -q -r -l 0 --no-cache -O \"%s\" \"%s\"",pcVar13,(ulong)uVar5,
               filename_local,url);
    }
    pcVar8 = local_78._data;
    sVar7 = strlen(local_78._data);
    uVar14 = sVar7 & 0xffffffff;
    if (uVar14 != 0) {
      pcVar13 = (char *)operator_new__((ulong)((int)sVar7 + 0x10));
      strncpy(pcVar13,pcVar8,uVar14);
      builtin_strncpy(pcVar13 + uVar14," 2> /dev/null",0xe);
      system(pcVar13);
      operator_delete__(pcVar13);
    }
    pFVar9 = ::fopen(filename_local,"rb");
    if (pFVar9 == (FILE *)0x0) {
      this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
      CImgIOException::CImgIOException
                (this_00,
                 "cimg::load_network(): Failed to load file \'%s\' with external commands \'wget\' or \'curl\'."
                 ,url);
      goto LAB_0011c73e;
    }
    if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (uVar5 = ::fclose(pFVar9), uVar5 != 0)) {
      warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar5);
    }
    snprintf(local_78._data,(ulong)local_78._width,"%s.gz",filename_local);
    rename(filename_local,local_78._data);
    pcVar8 = local_78._data;
    uVar14 = (ulong)local_78._width;
    pcVar13 = gunzip_path((char *)0x0,false);
    snprintf(pcVar8,uVar14,"%s --quiet \"%s.gz\"",pcVar13,filename_local);
    pcVar8 = local_78._data;
    sVar7 = strlen(local_78._data);
    uVar14 = sVar7 & 0xffffffff;
    if (uVar14 != 0) {
      pcVar13 = (char *)operator_new__((ulong)((int)sVar7 + 0x10));
      strncpy(pcVar13,pcVar8,uVar14);
      builtin_strncpy(pcVar13 + uVar14," 2> /dev/null",0xe);
      system(pcVar13);
      operator_delete__(pcVar13);
    }
    pFVar9 = ::fopen(filename_local,"rb");
    if (pFVar9 == (FILE *)0x0) {
      snprintf(local_78._data,(ulong)local_78._width,"%s.gz",filename_local);
      rename(local_78._data,filename_local);
      pFVar9 = ::fopen(filename_local,"rb");
    }
  }
  fseek(pFVar9,0,2);
  lVar11 = ftell(pFVar9);
  if (0 < lVar11) {
    if (pFVar9 == (FILE *)0x0) {
      warn("cimg::fclose(): Specified file is (null).");
    }
    else if (((_stdin != pFVar9) && (_stdout != pFVar9)) && (uVar5 = ::fclose(pFVar9), uVar5 != 0))
    {
      warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar5);
    }
    if ((local_78._is_shared == false) && (local_78._data != (char *)0x0)) {
      operator_delete__(local_78._data);
    }
    if ((local_50._is_shared == false) && ((byte *)local_50._data != (byte *)0x0)) {
      operator_delete__(local_50._data);
    }
    return filename_local;
  }
  this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (this_00,
             "cimg::load_network(): Failed to load URL \'%s\' with external commands \'wget\' or \'curl\'."
             ,url);
LAB_0011c73e:
  __cxa_throw(this_00,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

inline char *load_network(const char *const url, char *const filename_local,
                            const unsigned int timeout, const bool try_fallback) {
    if (!url)
      throw CImgArgumentException("cimg::load_network(): Specified URL is (null).");
    if (!filename_local)
      throw CImgArgumentException("cimg::load_network(): Specified destination string is (null).");

    const char *const __ext = cimg::split_filename(url), *const _ext = (*__ext && __ext>url)?__ext - 1:__ext;
    CImg<char> ext = CImg<char>::string(_ext);
    std::FILE *file = 0;
    *filename_local = 0;
    if (ext._width>16 || !cimg::strncasecmp(ext,"cgi",3)) *ext = 0;
    else cimg::strwindows_reserved(ext);
    do {
      cimg_snprintf(filename_local,256,"%s%c%s%s",
                    cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext._data);
      if ((file=std::fopen(filename_local,"rb"))!=0) cimg::fclose(file);
    } while (file);

#ifdef cimg_use_curl
    const unsigned int omode = cimg::exception_mode();
    cimg::exception_mode(0);
    try {
      CURL *curl = 0;
      CURLcode res;
      curl = curl_easy_init();
      if (curl) {
        file = cimg::fopen(filename_local,"wb");
        curl_easy_setopt(curl,CURLOPT_URL,url);
        curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,0);
        curl_easy_setopt(curl,CURLOPT_WRITEDATA,file);
        curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,0L);
        curl_easy_setopt(curl,CURLOPT_SSL_VERIFYHOST,0L);
        curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1L);
        if (timeout) curl_easy_setopt(curl,CURLOPT_TIMEOUT,(long)timeout);
        if (std::strchr(url,'?')) curl_easy_setopt(curl,CURLOPT_HTTPGET,1L);
        res = curl_easy_perform(curl);
        curl_easy_cleanup(curl);
        std::fseek(file,0,SEEK_END); // Check if file size is 0.
        const long siz = std::ftell(file);
        cimg::fclose(file);
        if (siz>0 && res==CURLE_OK) {
          cimg::exception_mode(omode);
          return filename_local;
        } else std::remove(filename_local);
      }
    } catch (...) { }
    cimg::exception_mode(omode);
    if (!try_fallback) throw CImgIOException("cimg::load_network(): Failed to load file '%s' with libcurl.",url);
#endif

    CImg<char> command((unsigned int)std::strlen(url) + 64);
    cimg::unused(try_fallback);

    // Try with 'curl' first.
    if (timeout)
      cimg_snprintf(command,command._width,"%s -m %u -f --silent --compressed -o \"%s\" \"%s\"",
                    cimg::curl_path(),timeout,filename_local,url);
    else
      cimg_snprintf(command,command._width,"%s -f --silent --compressed -o \"%s\" \"%s\"",
                    cimg::curl_path(),filename_local,url);
    cimg::system(command);

    if (!(file = std::fopen(filename_local,"rb"))) {

      // Try with 'wget' otherwise.
      if (timeout)
        cimg_snprintf(command,command._width,"%s -T %u -q -r -l 0 --no-cache -O \"%s\" \"%s\"",
                      cimg::wget_path(),timeout,filename_local,url);
      else
        cimg_snprintf(command,command._width,"%s -q -r -l 0 --no-cache -O \"%s\" \"%s\"",
                      cimg::wget_path(),filename_local,url);
      cimg::system(command);

      if (!(file = std::fopen(filename_local,"rb")))
        throw CImgIOException("cimg::load_network(): Failed to load file '%s' with external commands "
                              "'wget' or 'curl'.",url);
      cimg::fclose(file);

      // Try gunzip it.
      cimg_snprintf(command,command._width,"%s.gz",filename_local);
      std::rename(filename_local,command);
      cimg_snprintf(command,command._width,"%s --quiet \"%s.gz\"",
                    gunzip_path(),filename_local);
      cimg::system(command);
      file = std::fopen(filename_local,"rb");
      if (!file) {
        cimg_snprintf(command,command._width,"%s.gz",filename_local);
        std::rename(command,filename_local);
        file = std::fopen(filename_local,"rb");
      }
    }
    std::fseek(file,0,SEEK_END); // Check if file size is 0.
    if (std::ftell(file)<=0)
      throw CImgIOException("cimg::load_network(): Failed to load URL '%s' with external commands "
                            "'wget' or 'curl'.",url);
    cimg::fclose(file);
    return filename_local;
  }